

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_uniform_block_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  ostream *poVar2;
  ProgramSources *sources;
  ShaderProgram program;
  ostringstream shaderDecl;
  ostringstream shaderBody;
  string local_530;
  string local_510;
  string local_4f0;
  undefined1 local_4d0 [40];
  ProgramSources local_4a8;
  ShaderProgram local_3d8;
  ostringstream local_308 [376];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_308);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_308,"layout(std140, binding = 0) uniform Block\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    highp vec4 val;\n");
  poVar2 = std::operator<<(poVar2,"} block[");
  iVar1 = getResourceLimit(ctx,0x91bb);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 + 1);
  std::operator<<(poVar2,"];\n");
  renderCtx = ctx->m_renderCtx;
  memset(&local_4a8,0,0xac);
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4a8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4a8._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_4f0,ctx,&local_510,&local_530);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_4d0,&local_4f0);
  sources = glu::ProgramSources::operator<<(&local_4a8,(ShaderSource *)local_4d0);
  glu::ShaderProgram::ShaderProgram(&local_3d8,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_4d0 + 8));
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  glu::ProgramSources::~ProgramSources(&local_4a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,
             "Link error is generated if a compute shader exceeds GL_MAX_COMPUTE_UNIFORM_BLOCKS.",
             (allocator<char> *)local_4d0);
  NegativeTestContext::beginSection(ctx,(string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  verifyLinkError(ctx,&local_3d8);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_3d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  return;
}

Assistant:

void exceed_uniform_block_limit (NegativeTestContext& ctx)
{
	std::ostringstream shaderDecl;
	std::ostringstream shaderBody;

	shaderDecl	<< "layout(std140, binding = 0) uniform Block\n"
				<< "{\n"
				<< "    highp vec4 val;\n"
				<< "} block[" << getResourceLimit(ctx, GL_MAX_COMPUTE_UNIFORM_BLOCKS) + 1 << "];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if a compute shader exceeds GL_MAX_COMPUTE_UNIFORM_BLOCKS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}